

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# box_renderer.cpp
# Opt level: O2

string * __thiscall
duckdb::BoxRenderer::ToString
          (string *__return_storage_ptr__,BoxRenderer *this,ClientContext *context,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *names,ColumnDataCollection *result)

{
  StringResultRenderer ss;
  undefined1 local_70 [64];
  
  StringResultRenderer::StringResultRenderer((StringResultRenderer *)local_70);
  Render(this,context,names,result,(BaseResultRenderer *)local_70);
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)(local_70 + 0x20));
  StringResultRenderer::~StringResultRenderer((StringResultRenderer *)local_70);
  return __return_storage_ptr__;
}

Assistant:

string BoxRenderer::ToString(ClientContext &context, const vector<string> &names, const ColumnDataCollection &result) {
	StringResultRenderer ss;
	Render(context, names, result, ss);
	return ss.str();
}